

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int sftp_packet_require(LIBSSH2_SFTP *sftp,uchar packet_type,uint32_t request_id,uchar **data,
                       size_t *data_len,size_t required_size)

{
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  
  iVar2 = -0x27;
  if (data_len != (size_t *)0x0 && data != (uchar **)0x0) {
    pLVar1 = sftp->channel->session;
    do {
      iVar2 = sftp_packet_ask(sftp,packet_type,request_id,data,data_len);
      if (iVar2 == 0) {
        if (*data_len < required_size) {
          return -0x26;
        }
        return 0;
      }
      if (pLVar1->socket_state != 0) {
        return -0xd;
      }
      iVar2 = sftp_packet_read(sftp);
    } while (-1 < iVar2);
  }
  return iVar2;
}

Assistant:

static int
sftp_packet_require(LIBSSH2_SFTP *sftp, unsigned char packet_type,
                    uint32_t request_id, unsigned char **data,
                    size_t *data_len, size_t required_size)
{
    LIBSSH2_SESSION *session = sftp->channel->session;
    int rc;

    if(!data || !data_len || required_size == 0) {
        return LIBSSH2_ERROR_BAD_USE;
    }

    _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Requiring packet %u id %u",
                   (unsigned int) packet_type, request_id));

    if(sftp_packet_ask(sftp, packet_type, request_id, data, data_len) == 0) {
        /* The right packet was available in the packet brigade */
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Got %u",
                       (unsigned int) packet_type));

        if(*data_len < required_size) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }

        return LIBSSH2_ERROR_NONE;
    }

    while(session->socket_state == LIBSSH2_SOCKET_CONNECTED) {
        rc = sftp_packet_read(sftp);
        if(rc < 0)
            return rc;

        /* data was read, check the queue again */
        if(!sftp_packet_ask(sftp, packet_type, request_id, data, data_len)) {
            /* The right packet was available in the packet brigade */
            _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Got %d",
                           (unsigned int) packet_type));

            if(*data_len < required_size) {
                return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
            }

            return LIBSSH2_ERROR_NONE;
        }
    }

    /* Only reached if the socket died */
    return LIBSSH2_ERROR_SOCKET_DISCONNECT;
}